

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt_pbkdf.c
# Opt level: O0

void bcrypt_hash(uint8_t *sha2pass,uint8_t *sha2salt,uint8_t *out)

{
  uint32_t uVar1;
  uint16_t local_10ae;
  int local_10ac;
  uint16_t shalen;
  uint16_t j;
  int i;
  uint32_t cdata [8];
  uint8_t ciphertext [32];
  blf_ctx state;
  uint8_t *out_local;
  uint8_t *sha2salt_local;
  uint8_t *sha2pass_local;
  
  cdata[6] = 0x6379784f;
  cdata[7] = 0x6d6f7268;
  builtin_memcpy(ciphertext,"aticBlowfishSwatDynamite",0x18);
  Blowfish_initstate((blf_ctx *)(ciphertext + 0x18));
  Blowfish_expandstate((blf_ctx *)(ciphertext + 0x18),sha2salt,0x40,sha2pass,0x40);
  for (local_10ac = 0; local_10ac < 0x40; local_10ac = local_10ac + 1) {
    Blowfish_expand0state((blf_ctx *)(ciphertext + 0x18),sha2salt,0x40);
    Blowfish_expand0state((blf_ctx *)(ciphertext + 0x18),sha2pass,0x40);
  }
  local_10ae = 0;
  for (local_10ac = 0; local_10ac < 8; local_10ac = local_10ac + 1) {
    uVar1 = Blowfish_stream2word((uint8_t *)(cdata + 6),0x20,&local_10ae);
    *(uint32_t *)(&shalen + (long)local_10ac * 2) = uVar1;
  }
  for (local_10ac = 0; local_10ac < 0x40; local_10ac = local_10ac + 1) {
    blf_enc((blf_ctx *)(ciphertext + 0x18),(uint32_t *)&shalen,4);
  }
  for (local_10ac = 0; local_10ac < 8; local_10ac = local_10ac + 1) {
    out[local_10ac * 4 + 3] =
         (uint8_t)((uint)*(undefined4 *)(&shalen + (long)local_10ac * 2) >> 0x18);
    out[local_10ac * 4 + 2] =
         (uint8_t)((uint)*(undefined4 *)(&shalen + (long)local_10ac * 2) >> 0x10);
    out[local_10ac * 4 + 1] = (uint8_t)((uint)*(undefined4 *)(&shalen + (long)local_10ac * 2) >> 8);
    out[local_10ac << 2] = (uint8_t)*(undefined4 *)(&shalen + (long)local_10ac * 2);
  }
  explicit_bzero(cdata + 6,0x20);
  explicit_bzero(&shalen,0x20);
  explicit_bzero(ciphertext + 0x18,0x1048);
  return;
}

Assistant:

static void
bcrypt_hash(uint8_t *sha2pass, uint8_t *sha2salt, uint8_t *out)
{
    blf_ctx state;
    uint8_t ciphertext[BCRYPT_HASHSIZE] = {
        'O', 'x', 'y', 'c', 'h', 'r', 'o', 'm', 'a', 't', 'i', 'c',
        'B', 'l', 'o', 'w', 'f', 'i', 's', 'h',
        'S', 'w', 'a', 't',
        'D', 'y', 'n', 'a', 'm', 'i', 't', 'e' };
    uint32_t cdata[BCRYPT_BLOCKS];
    int i;
    uint16_t j;
    uint16_t shalen = SHA512_DIGEST_LENGTH;

    /* key expansion */
    Blowfish_initstate(&state);
    Blowfish_expandstate(&state, sha2salt, shalen, sha2pass, shalen);
    for(i = 0; i < 64; i++) {
        Blowfish_expand0state(&state, sha2salt, shalen);
        Blowfish_expand0state(&state, sha2pass, shalen);
    }

    /* encryption */
    j = 0;
    for(i = 0; i < BCRYPT_BLOCKS; i++)
        cdata[i] = Blowfish_stream2word(ciphertext, sizeof(ciphertext),
                                        &j);
    for(i = 0; i < 64; i++)
        blf_enc(&state, cdata, BCRYPT_BLOCKS / 2);

    /* copy out */
    for(i = 0; i < BCRYPT_BLOCKS; i++) {
        out[4 * i + 3] = (uint8_t)((cdata[i] >> 24) & 0xff);
        out[4 * i + 2] = (cdata[i] >> 16) & 0xff;
        out[4 * i + 1] = (cdata[i] >> 8) & 0xff;
        out[4 * i + 0] = cdata[i] & 0xff;
    }

    /* zap */
    _libssh2_explicit_zero(ciphertext, sizeof(ciphertext));
    _libssh2_explicit_zero(cdata, sizeof(cdata));
    _libssh2_explicit_zero(&state, sizeof(state));
}